

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndGroup(void)

{
  undefined4 uVar1;
  ImVec2 IVar2;
  undefined4 text_offset_y;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiGroupData *pIVar5;
  ImGuiContext *pIVar6;
  ulong uVar7;
  ImGuiContext *g;
  uint uVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  ImRect local_30;
  ImVec2 local_20;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->Accessed = true;
  uVar8 = (pIVar4->DC).GroupStack.Size;
  uVar7 = (ulong)uVar8;
  if (uVar7 == 0) {
    __assert_fail("!window->DC.GroupStack.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x23d6,"void ImGui::EndGroup()");
  }
  if (0 < (int)uVar8) {
    pIVar5 = (pIVar4->DC).GroupStack.Data;
    local_30.Min = pIVar5[uVar7 - 1].BackupCursorPos;
    fVar12 = local_30.Min.x;
    fVar13 = local_30.Min.y;
    IVar2 = (pIVar4->DC).CursorMaxPos;
    fVar10 = IVar2.x;
    fVar11 = IVar2.y;
    fVar14 = fVar11 - (pIVar6->Style).ItemSpacing.y;
    (pIVar4->DC).CursorPos = local_30.Min;
    uVar8 = -(uint)(fVar14 <= fVar13);
    local_30.Max = (ImVec2)(CONCAT44(~uVar8 & (uint)fVar14,~-(uint)(fVar10 <= fVar12) & (uint)fVar10
                                    ) |
                           CONCAT44((uint)fVar13 & uVar8,(uint)fVar12 & -(uint)(fVar10 <= fVar12)));
    fVar14 = pIVar5[uVar7 - 1].BackupCursorMaxPos.x;
    fVar15 = pIVar5[uVar7 - 1].BackupCursorMaxPos.y;
    uVar8 = -(uint)(fVar10 <= fVar14);
    uVar9 = -(uint)(fVar11 <= fVar15);
    (pIVar4->DC).CursorMaxPos =
         (ImVec2)(CONCAT44(~uVar9 & (uint)fVar11,~uVar8 & (uint)fVar10) |
                 CONCAT44((uint)fVar15 & uVar9,(uint)fVar14 & uVar8));
    uVar1 = pIVar5[uVar7 - 1].BackupCurrentLineHeight;
    text_offset_y = pIVar5[uVar7 - 1].BackupCurrentLineTextBaseOffset;
    (pIVar4->DC).CurrentLineHeight = (float)uVar1;
    (pIVar4->DC).CurrentLineTextBaseOffset = (float)text_offset_y;
    fVar10 = pIVar5[uVar7 - 1].BackupGroupOffsetX;
    (pIVar4->DC).IndentX = pIVar5[uVar7 - 1].BackupIndentX;
    (pIVar4->DC).GroupOffsetX = fVar10;
    (pIVar4->DC).LogLinePosY = fVar13 + -9999.0;
    if (pIVar5[uVar7 - 1].AdvanceCursor == true) {
      fVar10 = (pIVar4->DC).PrevLineTextBaseOffset;
      uVar8 = -(uint)((float)text_offset_y <= fVar10);
      (pIVar4->DC).CurrentLineTextBaseOffset =
           (float)(~uVar8 & text_offset_y | (uint)fVar10 & uVar8);
      local_20.x = local_30.Max.x - fVar12;
      local_20.y = local_30.Max.y - fVar13;
      ItemSize(&local_20,(float)text_offset_y);
      ItemAdd(&local_30,(ImGuiID *)0x0);
    }
    if ((((pIVar5[uVar7 - 1].BackupActiveIdIsAlive == false) && (pIVar6->ActiveIdIsAlive == true))
        && (pIVar6->ActiveId != 0)) && (pIVar6->ActiveIdWindow->RootWindow == pIVar4->RootWindow)) {
      (pIVar4->DC).LastItemId = pIVar6->ActiveId;
    }
    iVar3 = (pIVar4->DC).GroupStack.Size;
    if (0 < iVar3) {
      (pIVar4->DC).GroupStack.Size = iVar3 + -1;
      return;
    }
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                  ,0x370,"void ImVector<ImGuiGroupData>::pop_back() [T = ImGuiGroupData]");
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                ,0x35d,"value_type &ImVector<ImGuiGroupData>::back() [T = ImGuiGroupData]");
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    IM_ASSERT(!window->DC.GroupStack.empty());	// Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = window->DC.GroupStack.back();

    ImRect group_bb(group_data.BackupCursorPos, window->DC.CursorMaxPos);
    group_bb.Max.y -= g.Style.ItemSpacing.y;      // Cancel out last vertical spacing because we are adding one ourselves.
    group_bb.Max = ImMax(group_bb.Min, group_bb.Max);

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.CurrentLineHeight = group_data.BackupCurrentLineHeight;
    window->DC.CurrentLineTextBaseOffset = group_data.BackupCurrentLineTextBaseOffset;
    window->DC.IndentX = group_data.BackupIndentX;
    window->DC.GroupOffsetX = group_data.BackupGroupOffsetX;
    window->DC.LogLinePosY = window->DC.CursorPos.y - 9999.0f;

    if (group_data.AdvanceCursor)
    {
        window->DC.CurrentLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrentLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
        ItemSize(group_bb.GetSize(), group_data.BackupCurrentLineTextBaseOffset);
        ItemAdd(group_bb, NULL);
    }

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive() will function on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but if you search for LastItemId you'll notice it is only used in that context.
    if (!group_data.BackupActiveIdIsAlive && g.ActiveIdIsAlive && g.ActiveId && g.ActiveIdWindow->RootWindow == window->RootWindow)
        window->DC.LastItemId = g.ActiveId;

    window->DC.GroupStack.pop_back();

    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, 0xFFFF00FF);   // Debug
}